

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void NULLCIO::WriteLongConsole(longlong number,int base)

{
  char cVar1;
  undefined8 uVar2;
  code *pcVar3;
  int iVar4;
  size_t sVar5;
  int local_ac;
  char tmp;
  int i;
  int halfsize;
  int size;
  char *curr;
  char buf [128];
  bool sign;
  longlong lStack_10;
  int base_local;
  longlong number_local;
  
  buf._124_4_ = base;
  if ((base < 2) || (0x10 < base)) {
    nullcThrowError("ERROR: incorrect base %d",(ulong)(uint)base);
  }
  else if (writeFunc != (code *)0x0) {
    buf[0x7b] = number < 0;
    iVar4 = abs((int)(number % (long)base));
    curr._0_1_ = WriteLongConsole::symb[iVar4];
    _halfsize = (char *)((long)&curr + 1);
    lStack_10 = number;
    while (pcVar3 = writeFunc, uVar2 = contextFunc, lStack_10 = lStack_10 / (long)(int)buf._124_4_,
          lStack_10 != 0) {
      iVar4 = abs((int)(lStack_10 % (long)(int)buf._124_4_));
      *_halfsize = WriteLongConsole::symb[iVar4];
      _halfsize = _halfsize + 1;
    }
    if ((buf[0x7b] & 1U) != 0) {
      *_halfsize = '-';
      _halfsize = _halfsize + 1;
    }
    *_halfsize = '\0';
    iVar4 = (int)_halfsize - (int)&curr;
    for (local_ac = 0; local_ac < iVar4 >> 1; local_ac = local_ac + 1) {
      cVar1 = buf[(long)local_ac + -8];
      buf[(long)local_ac + -8] = buf[(long)((iVar4 - local_ac) + -1) + -8];
      buf[(long)((iVar4 - local_ac) + -1) + -8] = cVar1;
    }
    sVar5 = strlen((char *)&curr);
    (*pcVar3)(uVar2,&curr,sVar5 & 0xffffffff);
  }
  return;
}

Assistant:

void WriteLongConsole(long long number, int base)
	{
		if(!(base > 1 && base <= 16))
		{
			nullcThrowError("ERROR: incorrect base %d", base);
			return;
		}

		if(!writeFunc)
			return;

		static char symb[] = "0123456789abcdef";
		bool sign = 0;
		char buf[128];
		char *curr = buf;
		if(number < 0)
			sign = 1;

		*curr++ = *(abs(number % base) + symb);
		while(number /= base)
			*curr++ = *(abs(number % base) + symb);
		if(sign)
			*curr++ = '-';
		*curr = 0;
		int size = int(curr - buf), halfsize = size >> 1;
		for(int i = 0; i < halfsize; i++)
		{
			char tmp = buf[i];
			buf[i] = buf[size-i-1];
			buf[size-i-1] = tmp;
		}

		writeFunc(contextFunc, buf, (unsigned)strlen(buf));
	}